

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

char * ts_string_input_read(void *_self,uint32_t byte,TSPoint _,uint32_t *length)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  
  uVar2 = *(uint *)((long)_self + 8) - byte;
  if (*(uint *)((long)_self + 8) < byte || uVar2 == 0) {
    puVar1 = "";
    uVar2 = 0;
  }
  else {
    puVar1 = (uint8_t *)((ulong)byte + *_self);
  }
  *length = uVar2;
  return (char *)puVar1;
}

Assistant:

static const char *ts_string_input_read(void *_self, uint32_t byte, TSPoint _, uint32_t *length) {
  TSStringInput *self = (TSStringInput *)_self;
  if (byte >= self->length) {
    *length = 0;
    return "";
  } else {
    *length = self->length - byte;
    return self->string + byte;
  }
}